

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

QString * __thiscall
MakefileGenerator::buildArgs(QString *__return_storage_ptr__,MakefileGenerator *this,bool withExtra)

{
  long lVar1;
  QString *arg;
  QString *pQVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_78;
  QStringBuilder<const_char_(&)[2],_QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar2 = (Option::globals->qmake_args).d.ptr;
  for (lVar1 = (Option::globals->qmake_args).d.size * 0x18; lVar1 != 0; lVar1 = lVar1 + -0x18) {
    shellQuote((QString *)&local_78,this,pQVar2);
    local_58.b.d.size = local_78.size;
    local_58.b.d.ptr = local_78.ptr;
    local_58.b.d.d = local_78.d;
    local_58.a = (char (*) [2])0x21fe9e;
    local_78.d = (Data *)0x0;
    local_78.ptr = (char16_t *)0x0;
    local_78.size = 0;
    ::operator+=(__return_storage_ptr__,&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58.b.d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    pQVar2 = pQVar2 + 1;
  }
  if ((withExtra) && ((Option::globals->qmake_extra_args).d.size != 0)) {
    QString::operator+=(__return_storage_ptr__," --");
    pQVar2 = (Option::globals->qmake_extra_args).d.ptr;
    for (lVar1 = (Option::globals->qmake_extra_args).d.size * 0x18; lVar1 != 0;
        lVar1 = lVar1 + -0x18) {
      shellQuote((QString *)&local_78,this,pQVar2);
      local_58.b.d.size = local_78.size;
      local_58.b.d.ptr = local_78.ptr;
      local_58.b.d.d = local_78.d;
      local_58.a = (char (*) [2])0x21fe9e;
      local_78.d = (Data *)0x0;
      local_78.ptr = (char16_t *)0x0;
      local_78.size = 0;
      ::operator+=(__return_storage_ptr__,&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58.b.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      pQVar2 = pQVar2 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString MakefileGenerator::buildArgs(bool withExtra)
{
    QString ret;

    for (const QString &arg : std::as_const(Option::globals->qmake_args))
        ret += " " + shellQuote(arg);
    if (withExtra && !Option::globals->qmake_extra_args.isEmpty()) {
        ret += " --";
        for (const QString &arg : std::as_const(Option::globals->qmake_extra_args))
            ret += " " + shellQuote(arg);
    }
    return ret;
}